

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

SharedLocalization __thiscall ary::PlaneTracker::update(PlaneTracker *this,Mat *image)

{
  int id;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  PlanarLocalization *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  int i_1;
  long lVar2;
  long lVar3;
  int i;
  ulong uVar4;
  SharedLocalization SVar5;
  Matx<float,_3,_1> MVar6;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> image_points;
  vector<int,_std::allocator<int>_> inliers;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> object_points;
  Size2f local_290;
  undefined1 local_288 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> updates;
  _Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_240;
  _InputArray local_228;
  _InputArray local_210;
  _InputArray local_1f8;
  size_t *local_1e0;
  undefined1 local_1d8 [12];
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  _func_int **local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_170;
  undefined8 local_168;
  Mat transVec;
  Mat rotVec;
  _OutputArray local_90;
  _OutputArray local_78;
  _OutputArray local_60;
  _InputArray local_48;
  
  *(int *)&image[4].u = *(int *)&image[4].u + 1;
  if ((ulong)((long)image->u - (long)image->allocator) < 0x50) {
    (this->super_CameraUser)._vptr_CameraUser = (_func_int **)0x0;
    (this->super_CameraUser).camera.super_shared_ptr<ary::CameraModel>.
    super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  else {
    _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&updates;
    updates.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rotVec.data = (uchar *)0x0;
    updates.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    updates.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    rotVec.flags = 0x1010000;
    transVec.data = (uchar *)0x0;
    transVec.flags = 0x1010000;
    local_1c8 = 0.0;
    fStack_1c4 = 0.0;
    local_1d8._0_4_ = 0x8103000d;
    local_168 = 0;
    local_178 = (_func_int **)CONCAT44(local_178._4_4_,0x8303000d);
    object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(object_points.
                           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x82030000);
    image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(image + 3);
    image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(image_points.
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2010000);
    local_1e0 = (size_t *)0x1500000015;
    local_268 = 0x1e00000003;
    uStack_260 = 0x3f847ae147ae147b;
    object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)&image[2].step;
    rotVec._8_8_ = &image->step;
    unique0x100008f9 = (MatStep *)&image->allocator;
    cv::calcOpticalFlowPyrLK(0xeb1c432d);
    object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar3 = 0;
    lVar2 = 0;
    for (uVar4 = 0; uVar4 < (ulong)((long)image->u - (long)image->allocator >> 3); uVar4 = uVar4 + 1
        ) {
      if (*(char *)((long)image[2].step.p + uVar4) != '\0') {
        std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
                  (&object_points,(value_type *)(image->datastart + lVar2));
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                  (&image_points,
                   (value_type *)
                   ((long)&(updates.
                            super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->x + lVar3));
      }
      lVar2 = lVar2 + 0xc;
      lVar3 = lVar3 + 8;
    }
    cv::Mat::Mat(&rotVec);
    cv::Mat::Mat(&transVec);
    std::vector<int,_std::allocator<int>_>::vector
              (&inliers,(long)image_points.
                              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)image_points.
                              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3,
               (allocator_type *)local_1d8);
    local_1f8.sz.width = 0;
    local_1f8.sz.height = 0;
    local_210.sz.width = 0;
    local_210.sz.height = 0;
    local_1f8.flags = -0x7efcffeb;
    local_1f8.obj = &object_points;
    local_210.flags = -0x7efcfff3;
    local_210.obj = &image_points;
    CameraUser::getCameraModel((CameraUser *)(local_288 + 0x10));
    CameraModel::getIntrinsics((CameraModel *)local_288._16_8_);
    local_228.flags = -0x3efdfffb;
    local_228.sz.width = 3;
    local_228.sz.height = 3;
    local_228.obj = &local_178;
    CameraUser::getCameraModel((CameraUser *)local_288);
    CameraModel::getDistortion((Mat *)local_1d8,(CameraModel *)local_288._0_8_);
    local_48.sz.width = 0;
    local_48.sz.height = 0;
    local_48.flags = 0x1010000;
    local_60.super__InputArray.sz.width = 0;
    local_60.super__InputArray.sz.height = 0;
    local_60.super__InputArray.flags = 0x2010000;
    local_78.super__InputArray.sz.width = 0;
    local_78.super__InputArray.sz.height = 0;
    local_90.super__InputArray.sz.width = 0;
    local_90.super__InputArray.sz.height = 0;
    local_78.super__InputArray.flags = 0x2010000;
    local_90.super__InputArray.flags = -0x7dfcfffc;
    local_90.super__InputArray.obj = &inliers;
    local_78.super__InputArray.obj = &transVec;
    local_60.super__InputArray.obj = &rotVec;
    local_48.obj = (Mat *)local_1d8;
    cv::solvePnPRansac(&local_1f8,&local_210,&local_228,&local_48,&local_60,&local_78,false,0x96,1.0
                       ,0.9900000095367432,&local_90,0);
    cv::Mat::~Mat((Mat *)local_1d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_270);
    if ((ulong)((long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) < 0x28) {
      (this->super_CameraUser)._vptr_CameraUser = (_func_int **)0x0;
      (this->super_CameraUser).camera.super_shared_ptr<ary::CameraModel>.
      super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    }
    else {
      if ((MatAllocator *)image->u != image->allocator) {
        image->u = (UMatData *)image->allocator;
      }
      if (image->dataend != image->datastart) {
        image->dataend = image->datastart;
      }
      for (uVar4 = 0;
          uVar4 < (ulong)((long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                  ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                   &image->allocator,
                   image_points.
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                   inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4]);
        std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
                  ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                   &image->datastart,
                   object_points.
                   super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                   inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4]);
      }
      local_1c8 = 0.0;
      fStack_1c4 = 0.0;
      local_1d8._0_4_ = 0x2010000;
      unique0x10000901 = &image->step;
      cv::Mat::copyTo((_OutputArray *)in_RDX._M_pi);
      MVar6 = cv::Mat::operator_cast_to_Matx(&transVec);
      fStack_1c4 = MVar6.val[2];
      fStack_1cc = MVar6.val[0];
      local_1c8 = MVar6.val[1];
      MVar6 = cv::Mat::operator_cast_to_Matx(&rotVec);
      local_1d8._8_4_ = MVar6.val[2];
      local_1d8._0_8_ = MVar6.val._0_8_;
      this_00 = (PlanarLocalization *)operator_new(0x48);
      id = *(int *)((long)&image[4].u + 4);
      local_290.height = (float)(int)((ulong)image[4].allocator >> 0x20);
      local_290.width = (float)(int)image[4].allocator;
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&local_240,
                 (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &image[4].datastart);
      PlanarLocalization::PlanarLocalization
                (this_00,id,(CameraPosition *)local_1d8,&local_290,
                 (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&local_240,1.0);
      std::__shared_ptr<ary::PlanarLocalization,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<ary::PlanarLocalization,void>
                ((__shared_ptr<ary::PlanarLocalization,(__gnu_cxx::_Lock_policy)2> *)&local_178,
                 this_00);
      _Var1._M_pi = _Stack_170._M_pi;
      _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_CameraUser)._vptr_CameraUser = local_178;
      (this->super_CameraUser).camera.super_shared_ptr<ary::CameraModel>.
      super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var1._M_pi;
      local_178 = (_func_int **)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_170);
      std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
                (&local_240);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&inliers.super__Vector_base<int,_std::allocator<int>_>);
    cv::Mat::~Mat(&transVec);
    cv::Mat::~Mat(&rotVec);
    std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
              (&image_points.
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
    std::_Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~_Vector_base
              (&object_points.
                super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>);
    std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
              (&updates.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
    in_RDX._M_pi = extraout_RDX;
  }
  SVar5.super_shared_ptr<ary::Localization>.
  super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi
  ;
  SVar5.super_shared_ptr<ary::Localization>.
  super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedLocalization)
         SVar5.super_shared_ptr<ary::Localization>.
         super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedLocalization PlaneTracker::update(const Mat& image) {

    age++;

	if (keypoints_current.size() < 10)
		return Ptr<Localization>();

	vector<Point2f> updates;
	calcOpticalFlowPyrLK(previous, image, keypoints_current, updates, status, errors);

	vector<Point3f> object_points;
	vector<Point2f> image_points;

	for (int i = 0; i < keypoints_current.size(); i++) {
		if (status[i]) {
			object_points.push_back(keypoints_start[i]);
			image_points.push_back(updates[i]);
		}
	}

	Mat rotVec;
	Mat transVec;

	vector<int> inliers(image_points.size());

	solvePnPRansac(object_points, image_points, getCameraModel()->getIntrinsics(), getCameraModel()->getDistortion(), rotVec, transVec, false, 150, 1, 0.99f, inliers);


	if (inliers.size() < 10)
		return Ptr<Localization>();

	keypoints_current.clear();
	keypoints_start.clear();
	for (int i = 0; i < inliers.size(); i++) {
		keypoints_current.push_back(image_points[inliers[i]]);
		keypoints_start.push_back(object_points[inliers[i]]);
	}

	image.copyTo(previous);

	CameraPosition updated_camera = camera;

	updated_camera.translation = Matx31f(transVec);
	updated_camera.rotation = Matx31f(rotVec);

/*
	vector<Point2f> image_points2;
	projectPoints(keypoints_start, updated_camera.rotation, updated_camera.translation, getCameraModel()->getIntrinsics(), getCameraModel()->getDistortion(), image_points2);

	Mat test;
	image.copyTo(test);

	for (int i = 0; i < keypoints_start.size(); i++) {
		line(test, image_points2[i], keypoints_current[i], Scalar(255), 2);
	//cout <<  keypoints_current[i] << image_points2[i] << keypoints_start[i] << endl;

	}

	imshow("Test", test);
	//waitKey(0);
*/

	return Ptr<PlanarLocalization>(new PlanarLocalization(identifier, updated_camera, plane_size, plane_corners));
}